

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O1

double __thiscall ON_OutlineFigure::AreaEstimate(ON_OutlineFigure *this)

{
  double dVar1;
  bool bVar2;
  ON__UINT32 OVar3;
  ON_OutlineFigurePoint *pOVar4;
  uint uVar5;
  int tdex;
  long lVar6;
  double *pdVar7;
  int cvdex;
  ON__UINT32 OVar8;
  ulong uVar9;
  long lVar10;
  int tdex_1;
  double dVar11;
  double dVar12;
  ON_2dPoint OVar13;
  ON_OutlineFigurePoint p;
  ON_OutlineFigurePoint figure_start;
  double quad [3] [3];
  double cubic [3] [4];
  ON_2dPoint local_1f8;
  ON_OutlineFigurePoint *local_1e8;
  double local_1e0;
  double local_1d8;
  ON__UINT32 local_1cc;
  double local_1c8;
  ON_OutlineFigurePoint local_1c0;
  undefined1 local_1b0 [8];
  float local_1a8;
  ON_OutlineFigurePoint *local_1a0;
  ON_2dPoint local_198;
  ON_2dPoint local_188;
  ON_OutlineFigure *local_178;
  ON_2dPoint local_170;
  ON_2dPoint local_160;
  long local_150;
  ON_2dPoint local_148;
  ON_2dPoint local_138;
  ON_2dPoint local_128;
  ON_2dPoint local_118;
  ON_2dPoint local_108;
  ON_2dPoint local_f8;
  double local_e8 [7];
  double adStack_b0 [16];
  
  if (this->m_area_status == '\0') {
    this->m_area_estimate = ON_DBL_QNAN;
    this->m_area_status = '\a';
    OVar3 = Internal_FigureEndDex(this,false);
    if (OVar3 != 0) {
      local_1e8 = (this->m_points).m_a;
      local_1a8 = (local_1e8->m_point).y;
      local_1b0[0] = local_1e8->m_point_type;
      local_1b0[1] = local_1e8->m_point_proximity;
      local_1b0._2_2_ = local_1e8->m_figure_index;
      local_1b0._4_4_ = (local_1e8->m_point).x;
      local_178 = this;
      if (((OVar3 < 3) || (local_1b0[0] == '\x02')) ||
         (local_1e8[OVar3].m_point_type == EndFigureOpen)) {
        this->m_area_estimate = 0.0;
        this->m_area_status = '\x01';
      }
      else {
        local_e8[0] = -1.23432101234321e+308;
        adStack_b0[3] = -1.23432101234321e+308;
        ON_2dPoint::operator=(&local_1f8,(ON_2fPoint *)(local_1b0 + 4));
        uVar9 = 1;
        dVar12 = 0.0;
        pOVar4 = local_1e8;
        do {
          OVar8 = (ON__UINT32)uVar9;
          local_1c0.m_point.y = pOVar4[uVar9].m_point.y;
          pOVar4 = pOVar4 + uVar9;
          local_1c0.m_point_type = pOVar4->m_point_type;
          local_1c0.m_point_proximity = pOVar4->m_point_proximity;
          local_1c0.m_figure_index = pOVar4->m_figure_index;
          local_1c0.m_point.x = (pOVar4->m_point).x;
          local_1c8 = local_1f8.x;
          local_1e0 = local_1f8.y;
          ON_2dPoint::operator=(&local_1f8,&local_1c0.m_point);
          if (local_1c0.m_point_type == CubicBezierPoint) {
            bVar2 = ON_OutlineFigurePoint::IsOffFigure(&local_1c0);
            pOVar4 = local_1e8;
            if (bVar2) {
              if (OVar8 + 2 < OVar3) {
                if (local_1c0.m_point_type == local_1e8[OVar8 + 1].m_point_type) {
                  local_1a0 = local_1e8 + (OVar8 + 1);
                  local_1cc = OVar8 + 2;
                  bVar2 = ON_OutlineFigurePoint::IsOffFigure(local_1a0);
                  if (bVar2) {
                    uVar9 = (ulong)local_1cc;
                    if (local_1c0.m_point_type == pOVar4[uVar9].m_point_type) {
                      local_150 = uVar9 * 3;
                      bVar2 = ON_OutlineFigurePoint::IsOnFigure(pOVar4 + uVar9);
                      if (bVar2) {
                        if ((adStack_b0[3] == -1.23432101234321e+308) && (!NAN(adStack_b0[3]))) {
                          lVar6 = 1;
                          pdVar7 = adStack_b0 + 3;
                          do {
                            local_1d8 = (double)(int)lVar6 * 0.25;
                            lVar10 = 0;
                            do {
                              dVar1 = ON_EvaluateBernsteinBasis(3,(int)lVar10,local_1d8);
                              pdVar7[lVar10] = dVar1;
                              lVar10 = lVar10 + 1;
                            } while (lVar10 != 4);
                            lVar6 = lVar6 + 1;
                            pdVar7 = pdVar7 + 4;
                          } while (lVar6 != 4);
                        }
                        local_148.x = local_1c8;
                        local_148.y = local_1e0;
                        local_138.x = local_1f8.x;
                        local_138.y = local_1f8.y;
                        ON_2dPoint::operator=(&local_128,&local_1a0->m_point);
                        ON_2dPoint::operator=
                                  (&local_118,(ON_2fPoint *)(&(local_1e8->m_point).x + local_150));
                        local_1f8.x = local_1c8;
                        local_1f8.y = local_1e0;
                        lVar6 = 0x18;
                        do {
                          local_1e0 = local_1f8.x;
                          local_1d8 = local_1f8.y;
                          OVar13 = ::operator*(*(double *)((long)adStack_b0 + lVar6),&local_148);
                          local_198.y = OVar13.y;
                          local_198.x = OVar13.x;
                          OVar13 = ::operator*(*(double *)((long)adStack_b0 + lVar6 + 8),&local_138)
                          ;
                          local_170.y = OVar13.y;
                          local_170.x = OVar13.x;
                          OVar13 = ON_2dPoint::operator+(&local_198,&local_170);
                          local_188.y = OVar13.y;
                          local_188.x = OVar13.x;
                          OVar13 = ::operator*(*(double *)((long)adStack_b0 + lVar6 + 0x10),
                                               &local_128);
                          local_f8.y = OVar13.y;
                          local_f8.x = OVar13.x;
                          OVar13 = ON_2dPoint::operator+(&local_188,&local_f8);
                          local_160.y = OVar13.y;
                          local_160.x = OVar13.x;
                          OVar13 = ::operator*(*(double *)((long)adStack_b0 + lVar6 + 0x18),
                                               &local_118);
                          local_108.y = OVar13.y;
                          local_108.x = OVar13.x;
                          OVar13 = ON_2dPoint::operator+(&local_160,&local_108);
                          dVar11 = OVar13.y;
                          dVar1 = OVar13.x;
                          dVar12 = dVar12 + (local_1d8 + dVar11) * (local_1e0 - dVar1);
                          lVar6 = lVar6 + 0x20;
                          local_1f8.x = dVar1;
                          local_1f8.y = dVar11;
                        } while (lVar6 != 0x78);
                        local_1f8.x = local_118.x;
                        local_1f8.y = local_118.y;
                        dVar12 = dVar12 + (dVar11 + local_118.y) * (dVar1 - local_118.x);
                        bVar2 = true;
                        pOVar4 = local_1e8;
                        OVar8 = local_1cc;
                        goto LAB_004938ad;
                      }
                      goto LAB_0049389c;
                    }
                  }
                  bVar2 = false;
                  goto LAB_004938ad;
                }
              }
              goto LAB_004938bf;
            }
LAB_0049389c:
            bVar2 = false;
            pOVar4 = local_1e8;
          }
          else if (local_1c0.m_point_type == QuadraticBezierPoint) {
            bVar2 = ON_OutlineFigurePoint::IsOffFigure(&local_1c0);
            if (!bVar2) goto LAB_0049389c;
            uVar5 = OVar8 + 1;
            if (uVar5 < OVar3) {
              if (local_1c0.m_point_type == local_1e8[uVar5].m_point_type) {
                local_1a0 = local_1e8 + uVar5;
                local_1cc = uVar5;
                bVar2 = ON_OutlineFigurePoint::IsOnFigure(local_1a0);
                if (bVar2) {
                  if ((local_e8[0] == -1.23432101234321e+308) && (!NAN(local_e8[0]))) {
                    lVar6 = 1;
                    pdVar7 = local_e8;
                    do {
                      local_1d8 = (double)(int)lVar6 * 0.25;
                      lVar10 = 0;
                      do {
                        dVar1 = ON_EvaluateBernsteinBasis(2,(int)lVar10,local_1d8);
                        pdVar7[lVar10] = dVar1;
                        lVar10 = lVar10 + 1;
                      } while (lVar10 != 3);
                      lVar6 = lVar6 + 1;
                      pdVar7 = pdVar7 + 3;
                    } while (lVar6 != 4);
                  }
                  local_148.x = local_1c8;
                  local_148.y = local_1e0;
                  local_138.x = local_1f8.x;
                  local_138.y = local_1f8.y;
                  ON_2dPoint::operator=(&local_128,&local_1a0->m_point);
                  local_1f8.x = local_1c8;
                  local_1f8.y = local_1e0;
                  lVar6 = 0x10;
                  do {
                    local_1e0 = local_1f8.x;
                    local_1d8 = local_1f8.y;
                    OVar13 = ::operator*(*(double *)((long)&local_f8.x + lVar6),&local_148);
                    local_188.y = OVar13.y;
                    local_188.x = OVar13.x;
                    OVar13 = ::operator*(*(double *)((long)local_e8 + lVar6 + -8),&local_138);
                    local_198.y = OVar13.y;
                    local_198.x = OVar13.x;
                    OVar13 = ON_2dPoint::operator+(&local_188,&local_198);
                    local_160.y = OVar13.y;
                    local_160.x = OVar13.x;
                    OVar13 = ::operator*(*(double *)((long)local_e8 + lVar6),&local_128);
                    local_170.y = OVar13.y;
                    local_170.x = OVar13.x;
                    OVar13 = ON_2dPoint::operator+(&local_160,&local_170);
                    dVar11 = OVar13.y;
                    dVar1 = OVar13.x;
                    dVar12 = dVar12 + (local_1d8 + dVar11) * (local_1e0 - dVar1);
                    lVar6 = lVar6 + 0x18;
                    local_1f8.x = dVar1;
                    local_1f8.y = dVar11;
                  } while (lVar6 != 0x58);
                  local_1f8.x = local_128.x;
                  local_1f8.y = local_128.y;
                  dVar12 = dVar12 + (dVar11 + local_128.y) * (dVar1 - local_128.x);
                  bVar2 = true;
                  pOVar4 = local_1e8;
                  OVar8 = local_1cc;
                  goto LAB_004938ad;
                }
                goto LAB_0049389c;
              }
            }
LAB_004938bf:
            bVar2 = false;
            pOVar4 = local_1e8;
          }
          else {
            if (local_1c0.m_point_type != LineTo) goto LAB_0049389c;
            dVar12 = dVar12 + (local_1e0 + local_1f8.y) * (local_1c8 - local_1f8.x);
            bVar2 = true;
            pOVar4 = local_1e8;
          }
LAB_004938ad:
          if (!bVar2) break;
          OVar8 = OVar8 + 1;
          uVar9 = (ulong)OVar8;
        } while (OVar8 < OVar3);
        if (OVar8 == OVar3) {
          local_1e0 = local_1f8.x;
          local_1d8 = local_1f8.y;
          ON_2dPoint::operator=(&local_1f8,(ON_2fPoint *)(local_1b0 + 4));
          local_178->m_area_estimate =
               (dVar12 + (local_1d8 + local_1f8.y) * (local_1e0 - local_1f8.x)) * 0.5;
          local_178->m_area_status = '\x01';
          this = local_178;
          goto LAB_00493178;
        }
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
                   ,0x479,"","Area calculation failed.");
      }
      this = local_178;
      if ((local_178->m_figure_type < 5) && ((0x13U >> (local_178->m_figure_type & 0x1f) & 1) != 0))
      {
        local_178->m_figure_type = NotPerimeter;
      }
    }
  }
LAB_00493178:
  return this->m_area_estimate;
}

Assistant:

double ON_OutlineFigure::AreaEstimate() const
{
  while (0 == m_area_status)
  {
    m_area_estimate = ON_DBL_QNAN;
    m_area_status = 7;

    const ON__UINT32 figure_end_dex = Internal_FigureEndDex(false);
    if (0 == figure_end_dex)
      break;

    const ON_OutlineFigurePoint* a = m_points.Array();

    const ON_OutlineFigurePoint figure_start = a[0];
    const ON_OutlineFigurePoint figure_end = a[figure_end_dex];

    if (
      ON_OutlineFigurePoint::Type::BeginFigureOpen == figure_start.m_point_type
      || ON_OutlineFigurePoint::Type::EndFigureOpen == figure_end.m_point_type
      || figure_end_dex <= 2
      )
    {
      m_area_estimate = 0.0;
      m_area_status = 1;
      if (
        ON_OutlineFigure::Type::Perimeter == m_figure_type
        || ON_OutlineFigure::Type::Unset == m_figure_type
        || ON_OutlineFigure::Type::Unknown == m_figure_type
        )
      {
        m_figure_type = ON_OutlineFigure::Type::NotPerimeter;
      }
      break;
    }

    ON_2dPoint cv[4], p0, p1;

    double quad[3][3];
    double cubic[3][4];

    quad[0][0] = ON_UNSET_VALUE;
    cubic[0][0] = ON_UNSET_VALUE;
    double twice_area = 0.0;

    p1 = figure_start.m_point;
    ON__UINT32 i;
    for ( i = 1; i < figure_end_dex; i++)
    {
      const ON_OutlineFigurePoint p = a[i];
      p0 = p1;
      p1 = p.m_point;

      if (ON_OutlineFigurePoint::Type::LineTo == p.m_point_type)
      {
        twice_area += Internal_DeltaArea(p0, p1);
        continue;
      }

      if (ON_OutlineFigurePoint::Type::QuadraticBezierPoint == p.m_point_type)
      {
        if (
          p.IsOffFigure()
          && i + 1 < figure_end_dex
          && p.m_point_type == a[i + 1].m_point_type
          &&  a[i + 1].IsOnFigure()
          )
        {
          // approximate quadratic with 4 line segments
          if (ON_UNSET_VALUE == quad[0][0])
          {
            for (int tdex = 1; tdex <= 3; tdex++)
            {
              const double t = 0.25 * tdex;
              //const double s = 1.0 - t;
              for (int cvdex = 0; cvdex < 3; cvdex++)
              {
                quad[tdex - 1][cvdex] = ON_EvaluateBernsteinBasis(2, cvdex, t);
              }
            }
          }
          cv[0] = p0;
          cv[1] = p1;
          cv[2] = a[++i].m_point;
          p1 = p0;
          for (int j = 0; j < 3; j++)
          {
            p0 = p1;
            p1 = quad[j][0] * cv[0] + quad[j][1] * cv[1] + quad[j][2] * cv[2];
            twice_area += Internal_DeltaArea(p0, p1);
          }
          p0 = p1;
          p1 = cv[2];
          twice_area += Internal_DeltaArea(p0, p1);
          continue;
        }
        // error
        break;
      }

      if (ON_OutlineFigurePoint::Type::CubicBezierPoint == p.m_point_type)
      {
        if (
          // approximate cubic with 4 line segments
          p.IsOffFigure()
          && i + 2 < figure_end_dex
          && p.m_point_type == a[i + 1].m_point_type
          && a[i + 1].IsOffFigure()
          && p.m_point_type == a[i + 2].m_point_type
          && a[i + 2].IsOnFigure()
          )
        {
          if (ON_UNSET_VALUE == cubic[0][0])
          {
            for (int tdex = 1; tdex <= 3; tdex++)
            {
              const double t = 0.25 * tdex;
              //const double s = 1.0 - t;
              for (int cvdex = 0; cvdex < 4; cvdex++)
              {
                cubic[tdex - 1][cvdex] = ON_EvaluateBernsteinBasis(3, cvdex, t);
              }
            }
          }
          cv[0] = p0;
          cv[1] = p1;
          cv[2] = a[++i].m_point;
          cv[3] = a[++i].m_point;
          p1 = p0;
          for (int j = 0; j < 3; j++)
          {
            p0 = p1;
            p1 = cubic[j][0] * cv[0] + cubic[j][1] * cv[1] + cubic[j][2] * cv[2] + cubic[j][3] * cv[3];
            twice_area += Internal_DeltaArea(p0, p1);
          }
          p0 = p1;
          p1 = cv[3];
          twice_area += Internal_DeltaArea(p0, p1);
          continue;
        }
        // error
        break;
      }

      break;
    }

    if (i != figure_end_dex)
    {
      ON_ERROR("Area calculation failed.");
      if (
        ON_OutlineFigure::Type::Perimeter == m_figure_type
        || ON_OutlineFigure::Type::Unset == m_figure_type
        || ON_OutlineFigure::Type::Unknown == m_figure_type
        )
      {
        m_figure_type = ON_OutlineFigure::Type::NotPerimeter;
      }
      break; // error
    }

    p0 = p1;
    p1 = figure_start.m_point;
    twice_area += Internal_DeltaArea(p0, p1);

    m_area_estimate = 0.5*twice_area;
    m_area_status = 1;
    break;
  }

  return m_area_estimate;
}